

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturedmesh.cc
# Opt level: O3

void __thiscall gvr::TexturedMesh::loadPLY(TexturedMesh *this,PLYReader *ply)

{
  string *this_00;
  string *s;
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t *psVar4;
  char *__s;
  char *pcVar5;
  bool bVar6;
  ply_type pVar7;
  ply_type pVar8;
  long lVar9;
  ulong uVar10;
  TexturedMesh *pTVar11;
  long lVar12;
  bool bVar13;
  FloatArrayReceiver ss;
  FloatArrayReceiver vx;
  FloatArrayReceiver tv;
  FloatArrayReceiver tu;
  FloatArrayReceiver ny;
  FloatArrayReceiver nx;
  FloatArrayReceiver sy;
  FloatArrayReceiver sx;
  FloatArrayReceiver se;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comment;
  FloatArrayReceiver vy;
  TriangleReceiver tr;
  FloatArrayReceiver vz;
  FloatArrayReceiver nz;
  FloatArrayReceiver sz;
  FloatArrayReceiver sc;
  string local_3f8;
  ply_type local_3d4;
  string local_3d0;
  FloatArrayReceiver local_3b0;
  FloatArrayReceiver local_390;
  TexturedMesh *local_370;
  FloatArrayReceiver local_368;
  FloatArrayReceiver local_348;
  FloatArrayReceiver local_328;
  FloatArrayReceiver local_308;
  FloatArrayReceiver local_2e8;
  FloatArrayReceiver local_2c8;
  FloatArrayReceiver local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  FloatArrayReceiver local_268;
  long local_248;
  PLYReceiver local_240;
  TexturedMesh *local_238;
  string local_230;
  FloatArrayReceiver local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  FloatArrayReceiver local_90;
  FloatArrayReceiver local_70;
  FloatArrayReceiver local_50;
  
  local_390.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_390.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"vertex","");
  local_248 = PLYReader::instancesOfElement(ply,(string *)&local_390);
  if (local_390.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_390.size) {
    operator_delete(local_390.super_PLYReceiver._vptr_PLYReceiver);
  }
  Model::setOriginFromPLY((Model *)this,ply);
  this_00 = &this->basepath;
  local_370 = this;
  std::__cxx11::string::_M_replace
            ((ulong)this_00,0,(char *)(this->basepath)._M_string_length,0x162a42);
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PLYReader::getComments(ply,&local_288);
  if (local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar12 = 0;
    uVar10 = 0;
    do {
      lVar9 = std::__cxx11::string::find
                        ((char *)((long)&((local_288.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar12),0x1630b4,0);
      if ((lVar9 == 0) ||
         (lVar9 = std::__cxx11::string::find
                            ((char *)((long)&((local_288.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar12),0x1630c0,0), lVar9 == 0)) {
        std::__cxx11::string::substr
                  ((ulong)&local_390,
                   (long)&((local_288.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar12);
        pTVar11 = local_370;
        s = &local_370->name;
        std::__cxx11::string::operator=((string *)s,(string *)&local_390);
        if (local_390.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_390.size) {
          operator_delete(local_390.super_PLYReceiver._vptr_PLYReceiver);
        }
        gutil::trim(s);
        __s = (ply->filename)._M_dataplus._M_p;
        pcVar5 = (char *)(pTVar11->basepath)._M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar5,(ulong)__s);
        lVar12 = std::__cxx11::string::find_last_of((char *)this_00,0x1630cc,0xffffffffffffffff);
        if (lVar12 == -1) {
          std::__cxx11::string::_M_replace
                    ((ulong)this_00,0,(char *)(pTVar11->basepath)._M_string_length,0x162a42);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_390,(ulong)this_00);
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_390);
          if (local_390.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_390.size) {
            operator_delete(local_390.super_PLYReceiver._vptr_PLYReceiver);
          }
        }
        break;
      }
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 0x20;
    } while (uVar10 < (ulong)((long)local_288.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_288.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_390.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_390.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"vertex","");
  local_268.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_268.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"scan_size","");
  local_3d4 = PLYReader::getTypeOfProperty(ply,(string *)&local_390,(string *)&local_268);
  uVar10 = 1;
  if (local_3d4 == ply_none) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"vertex","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"scan_error","");
    pVar7 = PLYReader::getTypeOfProperty(ply,&local_b0,&local_d0);
    if (pVar7 != ply_none) goto LAB_0012e5ae;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"vertex","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"scan_conf","");
    pVar7 = PLYReader::getTypeOfProperty(ply,&local_1d0,&local_f0);
    uVar10 = (ulong)(pVar7 != ply_none);
    bVar13 = true;
  }
  else {
LAB_0012e5ae:
    bVar13 = false;
  }
  local_210.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_210.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"vertex","");
  local_3b0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_3b0.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"sx","");
  pVar7 = PLYReader::getTypeOfProperty(ply,(string *)&local_210,(string *)&local_3b0);
  if (pVar7 != ply_none) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"vertex","");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"sy","");
    pVar8 = PLYReader::getTypeOfProperty(ply,&local_110,&local_130);
    if (pVar8 != ply_none) {
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"vertex","");
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"sz","");
      PLYReader::getTypeOfProperty(ply,&local_1f0,&local_150);
      bVar6 = true;
      goto LAB_0012e6f5;
    }
  }
  bVar6 = false;
LAB_0012e6f5:
  (*(local_370->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(local_370,local_248,uVar10)
  ;
  pTVar11 = local_370;
  if (bVar6) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
  }
  if (pVar7 != ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
  }
  if (local_3b0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_3b0.size) {
    operator_delete(local_3b0.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_210.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_210.size) {
    operator_delete(local_210.super_PLYReceiver._vptr_PLYReceiver);
  }
  pVar7 = local_3d4;
  psVar1 = &local_3b0.size;
  if (bVar13) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
  }
  if (pVar7 == ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if (local_268.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_268.size) {
    operator_delete(local_268.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_390.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_390.size) {
    operator_delete(local_390.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver
            (&local_390,(pTVar11->super_Mesh).super_PointCloud.vertex,3,0);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_268,(pTVar11->super_Mesh).super_PointCloud.vertex,3,1);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_210,(pTVar11->super_Mesh).super_PointCloud.vertex,3,2);
  local_3b0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"vertex","");
  psVar4 = &local_2a8.size;
  local_2a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"x","");
  PLYReader::setReceiver(ply,(string *)&local_3b0,(string *)&local_2a8,&local_390.super_PLYReceiver)
  ;
  if (local_2a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_3b0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_3b0.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_3b0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"vertex","");
  local_2a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"y","");
  PLYReader::setReceiver(ply,(string *)&local_3b0,(string *)&local_2a8,&local_268.super_PLYReceiver)
  ;
  if (local_2a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_3b0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_3b0.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_3b0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"vertex","");
  local_2a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"z","");
  PLYReader::setReceiver(ply,(string *)&local_3b0,(string *)&local_2a8,&local_210.super_PLYReceiver)
  ;
  if (local_2a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_3b0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_3b0.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver
            (&local_3b0,(pTVar11->super_Mesh).super_PointCloud.scanprop,3,0);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_2a8,(pTVar11->super_Mesh).super_PointCloud.scanprop,3,1);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_50,(pTVar11->super_Mesh).super_PointCloud.scanprop,3,2);
  if ((pTVar11->super_Mesh).super_PointCloud.scanprop != (float *)0x0) {
    psVar1 = &local_2c8.size;
    local_2c8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"vertex","");
    psVar4 = &local_2e8.size;
    local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"scan_size","");
    PLYReader::setReceiver
              (ply,(string *)&local_2c8,(string *)&local_2e8,&local_3b0.super_PLYReceiver);
    if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2c8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
      operator_delete(local_2c8.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_2c8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"vertex","");
    local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"scan_error","");
    PLYReader::setReceiver
              (ply,(string *)&local_2c8,(string *)&local_2e8,&local_2a8.super_PLYReceiver);
    if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2c8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
      operator_delete(local_2c8.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_2c8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"vertex","");
    local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"scan_conf","");
    PLYReader::setReceiver
              (ply,(string *)&local_2c8,(string *)&local_2e8,&local_50.super_PLYReceiver);
    if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2c8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
      operator_delete(local_2c8.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  FloatArrayReceiver::FloatArrayReceiver
            (&local_2c8,(pTVar11->super_Mesh).super_PointCloud.scanpos,3,0);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_2e8,(pTVar11->super_Mesh).super_PointCloud.scanpos,3,1);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_70,(pTVar11->super_Mesh).super_PointCloud.scanpos,3,2);
  if ((pTVar11->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
    psVar1 = &local_308.size;
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"vertex","");
    psVar4 = &local_328.size;
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"sx","");
    PLYReader::setReceiver
              (ply,(string *)&local_308,(string *)&local_328,&local_2c8.super_PLYReceiver);
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"vertex","");
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"sy","");
    PLYReader::setReceiver
              (ply,(string *)&local_308,(string *)&local_328,&local_2e8.super_PLYReceiver);
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"vertex","");
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"sz","");
    PLYReader::setReceiver
              (ply,(string *)&local_308,(string *)&local_328,&local_70.super_PLYReceiver);
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_308,(pTVar11->super_Mesh).normal,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_328,(pTVar11->super_Mesh).normal,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_90,(pTVar11->super_Mesh).normal,3,2);
  psVar1 = &local_348.size;
  local_348.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"vertex","");
  psVar4 = &local_368.size;
  local_368.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"nx","");
  PLYReader::setReceiver(ply,(string *)&local_348,(string *)&local_368,&local_308.super_PLYReceiver)
  ;
  if (local_368.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_368.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_348.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_348.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_348.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"vertex","");
  local_368.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"ny","");
  PLYReader::setReceiver(ply,(string *)&local_348,(string *)&local_368,&local_328.super_PLYReceiver)
  ;
  if (local_368.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_368.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_348.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_348.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_348.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"vertex","");
  local_368.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"nz","");
  PLYReader::setReceiver(ply,(string *)&local_348,(string *)&local_368,&local_90.super_PLYReceiver);
  if (local_368.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_368.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_348.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_348.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_348,pTVar11->uv,2,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_368,pTVar11->uv,2,1);
  paVar2 = &local_3f8.field_2;
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  paVar3 = &local_3d0.field_2;
  local_3d0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"u","");
  PLYReader::setReceiver(ply,&local_3f8,&local_3d0,&local_348.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  local_3d0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"v","");
  PLYReader::setReceiver(ply,&local_3f8,&local_3d0,&local_368.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  local_3d0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"texture_u","");
  PLYReader::setReceiver(ply,&local_3f8,&local_3d0,&local_348.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  local_3d0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"texture_v","");
  PLYReader::setReceiver(ply,&local_3f8,&local_3d0,&local_368.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  local_3d0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"s","");
  PLYReader::setReceiver(ply,&local_3f8,&local_3d0,&local_348.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  local_3d0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"t","");
  PLYReader::setReceiver(ply,&local_3f8,&local_3d0,&local_368.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"face","");
  uVar10 = PLYReader::instancesOfElement(ply,&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  (*(pTVar11->super_Mesh).super_PointCloud.super_Model._vptr_Model[10])(pTVar11,uVar10 & 0xffffffff)
  ;
  local_240._vptr_PLYReceiver = (_func_int **)&PTR_setValue_00177240;
  local_238 = pTVar11;
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"face","");
  local_3d0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"vertex_index","");
  PLYReader::setReceiver(ply,&local_3f8,&local_3d0,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"face","");
  local_3d0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"vertex_indices","");
  PLYReader::setReceiver(ply,&local_3f8,&local_3d0,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  PLYReader::readData(ply);
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  local_3d0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"nx","");
  pVar7 = PLYReader::getTypeOfProperty(ply,&local_3f8,&local_3d0);
  if (pVar7 == ply_none) {
    bVar13 = true;
  }
  else {
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"vertex","");
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"ny","");
    pVar7 = PLYReader::getTypeOfProperty(ply,&local_230,&local_170);
    if (pVar7 == ply_none) {
      bVar13 = true;
    }
    else {
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"vertex","");
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"nz","");
      pVar7 = PLYReader::getTypeOfProperty(ply,&local_190,&local_1b0);
      bVar13 = pVar7 == ply_none;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      pTVar11 = local_370;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if (bVar13) {
    Mesh::recalculateNormals(&pTVar11->super_Mesh);
  }
  else {
    Mesh::normalizeNormals(&pTVar11->super_Mesh);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  return;
}

Assistant:

void TexturedMesh::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // get texture name

  basepath="";

  std::vector<std::string> comment;
  ply.getComments(comment);

  for (size_t i=0; i<comment.size(); i++)
  {
    size_t k=comment[i].find("TextureFile");

    if (k != 0)
    {
      k=comment[i].find("texturefile");
    }

    if (k == 0)
    {
      name=comment[i].substr(11);
      gutil::trim(name);

      basepath=ply.getName();

      size_t j=basepath.find_last_of("/\\");

      if (j != basepath.npos)
      {
        basepath=basepath.substr(0, j+1);
      }
      else
      {
        basepath="";
      }

      break;
    }
  }

  // set receiver for vertices

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  FloatArrayReceiver nx(getNormalArray(), 3, 0), ny(getNormalArray(), 3, 1), nz(getNormalArray(), 3,
      2);

  ply.setReceiver("vertex", "nx", &nx);
  ply.setReceiver("vertex", "ny", &ny);
  ply.setReceiver("vertex", "nz", &nz);

  FloatArrayReceiver tu(getTextureCoordArray(), 2, 0), tv(getTextureCoordArray(), 2, 1);

  ply.setReceiver("vertex", "u", &tu);
  ply.setReceiver("vertex", "v", &tv);
  ply.setReceiver("vertex", "texture_u", &tu);
  ply.setReceiver("vertex", "texture_v", &tv);
  ply.setReceiver("vertex", "s", &tu);
  ply.setReceiver("vertex", "t", &tv);

  // set receiver for triangles

  int tn=static_cast<int>(ply.instancesOfElement("face"));

  resizeTriangleList(tn);

  TriangleReceiver tr(*this);

  ply.setReceiver("face", "vertex_index", &tr);
  ply.setReceiver("face", "vertex_indices", &tr);

  // read data and calculate normals

  ply.readData();

  if (ply.getTypeOfProperty("vertex", "nx") == ply_none ||
      ply.getTypeOfProperty("vertex", "ny") == ply_none ||
      ply.getTypeOfProperty("vertex", "nz") == ply_none)
  {
    recalculateNormals();
  }
  else
  {
    normalizeNormals();
  }
}